

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O1

Token * next(Token *__return_storage_ptr__,vector<Token,_std::allocator<Token>_> *input,int index)

{
  _Alloc_hider _Var1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  pointer pTVar5;
  vector<Token,_std::allocator<Token>_> local_38;
  
  std::vector<Token,_std::allocator<Token>_>::vector(&local_38,input);
  uVar2 = (ulong)index;
  pTVar5 = local_38.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start + uVar2;
  do {
    pTVar5 = pTVar5 + 1;
    uVar2 = uVar2 + 1;
    if (pTVar5->type != EOL) break;
  } while (uVar2 < ((long)local_38.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_38.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 - 1U);
  lVar4 = ((long)local_38.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_38.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  iVar3 = (int)lVar4 + -1;
  if (uVar2 < lVar4 - 1U) {
    iVar3 = (int)uVar2;
  }
  pTVar5 = (input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __return_storage_ptr__->type = pTVar5[iVar3].type;
  (__return_storage_ptr__->source)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->source).field_2;
  _Var1._M_p = pTVar5[iVar3].source._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->source,_Var1._M_p,
             _Var1._M_p + pTVar5[iVar3].source._M_string_length);
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Token next(vector<Token> input, int index) {
	return input[nextIndex(input, index)];
}